

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  ostream *this;
  char **ppcVar9;
  ifstream *this_00;
  long lVar10;
  int local_480;
  int num_column;
  char *local_470;
  string input_data_type;
  ulong local_440;
  string print_format;
  string local_418;
  string data_types;
  DataTransformWrapper data_transform;
  string str;
  ios_base local_360 [264];
  string output_data_type;
  ifstream ifs;
  char local_228 [16];
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  num_column = 1;
  print_format._M_dataplus._M_p = (pointer)&print_format.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&print_format,"");
  data_types._M_dataplus._M_p = (pointer)&data_types.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&data_types,"da","");
  local_440 = 2;
LAB_0010a770:
  do {
    iVar6 = ya_getopt_long(argc,argv,"re:c:f:h",(option *)0x0,(int *)0x0);
    sVar2 = print_format._M_string_length;
    pcVar1 = ya_optarg;
    switch(iVar6) {
    case 99:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&str);
      bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&num_column);
      bVar4 = num_column < 1;
      if (_ifs != local_228) {
        operator_delete(_ifs);
      }
      if (!bVar3 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&ifs,"The argument for the -c option must be a positive integer",0x39)
        ;
        str._M_dataplus._M_p = (pointer)&str.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&str,"x2x","");
        sptk::PrintErrorMessage(&str,(ostringstream *)&ifs);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p);
        }
        goto LAB_0010b0d3;
      }
      goto LAB_0010a770;
    case 100:
    case 0x67:
      goto switchD_0010a799_caseD_64;
    case 0x65:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&str);
      bVar4 = sptk::ConvertStringToInteger((string *)&ifs,(int *)&input_data_type);
      if (bVar4) {
        bVar4 = sptk::IsInRange((int)input_data_type._M_dataplus._M_p,0,2);
        if (_ifs != local_228) {
          operator_delete(_ifs);
        }
        if (bVar4) {
          local_440 = (ulong)input_data_type._M_dataplus._M_p & 0xffffffff;
          goto LAB_0010a770;
        }
      }
      else if (_ifs != local_228) {
        operator_delete(_ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&ifs,"The argument for the -e option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ifs,"in the range of ",0x10);
      this = (ostream *)std::ostream::operator<<((ostream *)&ifs,0);
      std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
      std::ostream::operator<<((ostream *)this,2);
      str._M_dataplus._M_p = (pointer)&str.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&str,"x2x","");
      sptk::PrintErrorMessage(&str,(ostringstream *)&ifs);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)str._M_dataplus._M_p != &str.field_2) {
        operator_delete(str._M_dataplus._M_p);
      }
      goto LAB_0010b0d3;
    case 0x66:
      strlen(ya_optarg);
      std::__cxx11::string::_M_replace((ulong)&print_format,0,(char *)sVar2,(ulong)pcVar1);
      std::__cxx11::string::substr((ulong)&ifs,(ulong)&print_format);
      iVar6 = std::__cxx11::string::compare((char *)&ifs);
      if (_ifs != local_228) {
        operator_delete(_ifs);
      }
      if (iVar6 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&ifs,"The argument for the -f option must be begin with %",0x33);
        str._M_dataplus._M_p = (pointer)&str.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&str,"x2x","");
        sptk::PrintErrorMessage(&str,(ostringstream *)&ifs);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p);
        }
        goto LAB_0010b0d3;
      }
      goto LAB_0010a770;
    case 0x68:
      local_480 = 0;
      anon_unknown.dwarf_21a7::PrintUsage((ostream *)&std::cout);
      goto LAB_0010b0fe;
    }
    if (iVar6 == -1) {
      uVar7 = argc - ya_optind;
      if (uVar7 == 0 || argc < ya_optind) {
        local_470 = (char *)0x0;
        goto LAB_0010abd2;
      }
      local_480 = 0;
      lVar10 = (ulong)uVar7 + 1;
      ppcVar9 = argv + ((long)argc - (ulong)uVar7);
      local_470 = (char *)0x0;
      goto LAB_0010aa67;
    }
  } while (iVar6 == 0x72);
switchD_0010a799_caseD_64:
  local_480 = 1;
  anon_unknown.dwarf_21a7::PrintUsage((ostream *)&std::cerr);
  goto LAB_0010b0fe;
LAB_0010aa67:
  do {
    pcVar1 = *ppcVar9;
    if (*pcVar1 == '+') {
      str._M_dataplus._M_p = (pointer)&str.field_2;
      sVar8 = strlen(pcVar1);
      std::__cxx11::string::_M_construct<char_const*>((string *)&str,pcVar1,pcVar1 + sVar8);
      std::__cxx11::string::substr((ulong)&ifs,(ulong)&str);
      std::__cxx11::string::operator=((string *)&data_types,(string *)&ifs);
      if (_ifs != local_228) {
        operator_delete(_ifs);
      }
      sVar2 = data_types._M_string_length;
      if (data_types._M_string_length != 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&ifs,"The +type option must be two characters",0x27);
        input_data_type._M_dataplus._M_p = (pointer)&input_data_type.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&input_data_type,"x2x","");
        sptk::PrintErrorMessage(&input_data_type,(ostringstream *)&ifs);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)input_data_type._M_dataplus._M_p != &input_data_type.field_2) {
          operator_delete(input_data_type._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        std::ios_base::~ios_base(local_1c8);
        local_480 = 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)str._M_dataplus._M_p != &str.field_2) {
        operator_delete(str._M_dataplus._M_p);
      }
      if (sVar2 != 2) goto LAB_0010b0fe;
    }
    else {
      bVar4 = local_470 != (char *)0x0;
      local_470 = pcVar1;
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&ifs,"Too many input files",0x14);
        str._M_dataplus._M_p = (pointer)&str.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&str,"x2x","");
        sptk::PrintErrorMessage(&str,(ostringstream *)&ifs);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p);
        }
        goto LAB_0010b0d3;
      }
    }
    lVar10 = lVar10 + -1;
    ppcVar9 = ppcVar9 + 1;
  } while (1 < lVar10);
LAB_0010abd2:
  bVar4 = sptk::SetBinaryMode();
  pcVar1 = local_470;
  if (bVar4) {
    this_00 = &ifs;
    std::ifstream::ifstream(this_00);
    if ((pcVar1 == (char *)0x0) ||
       (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar1),
       (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
      cVar5 = std::__basic_file<char>::is_open();
      if (cVar5 == '\0') {
        this_00 = (ifstream *)&std::cin;
      }
      std::__cxx11::string::substr((ulong)&input_data_type,(ulong)&data_types);
      std::__cxx11::string::substr((ulong)&output_data_type,(ulong)&data_types);
      anon_unknown.dwarf_21a7::DataTransformWrapper::DataTransformWrapper
                (&data_transform,&input_data_type,&output_data_type,
                 (string *)print_format._M_dataplus._M_p,(int)print_format._M_string_length,
                 num_column,SUB81(local_440,0));
      if (data_transform.data_transform_ == (DataTransformInterface *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&str,"Unexpected argument for the +type option",0x28);
        local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"x2x","");
        sptk::PrintErrorMessage(&local_418,(ostringstream *)&str);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
        std::ios_base::~ios_base(local_360);
        local_480 = 1;
      }
      else {
        iVar6 = (*(data_transform.data_transform_)->_vptr_DataTransformInterface[2])
                          (data_transform.data_transform_,this_00);
        local_480 = 0;
        if ((char)iVar6 == '\0') {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&str,"Failed to transform",0x13);
          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"x2x","");
          sptk::PrintErrorMessage(&local_418,(ostringstream *)&str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p != &local_418.field_2) {
            operator_delete(local_418._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
          std::ios_base::~ios_base(local_360);
          local_480 = 1;
        }
        (*(data_transform.data_transform_)->_vptr_DataTransformInterface[1])
                  (data_transform.data_transform_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)output_data_type._M_dataplus._M_p != &output_data_type.field_2) {
        operator_delete(output_data_type._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)input_data_type._M_dataplus._M_p != &input_data_type.field_2) {
        operator_delete(input_data_type._M_dataplus._M_p);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"Cannot open file ",0x11);
      sVar8 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,pcVar1,sVar8);
      input_data_type._M_dataplus._M_p = (pointer)&input_data_type.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&input_data_type,"x2x","");
      sptk::PrintErrorMessage(&input_data_type,(ostringstream *)&str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)input_data_type._M_dataplus._M_p != &input_data_type.field_2) {
        operator_delete(input_data_type._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
      std::ios_base::~ios_base(local_360);
      local_480 = 1;
    }
    std::ifstream::~ifstream(&ifs);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ifs,"Cannot set translation mode",0x1b);
    str._M_dataplus._M_p = (pointer)&str.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&str,"x2x","");
    sptk::PrintErrorMessage(&str,(ostringstream *)&ifs);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p != &str.field_2) {
      operator_delete(str._M_dataplus._M_p);
    }
LAB_0010b0d3:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
    std::ios_base::~ios_base(local_1c8);
    local_480 = 1;
  }
LAB_0010b0fe:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)data_types._M_dataplus._M_p != &data_types.field_2) {
    operator_delete(data_types._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)print_format._M_dataplus._M_p != &print_format.field_2) {
    operator_delete(print_format._M_dataplus._M_p);
  }
  return local_480;
}

Assistant:

int main(int argc, char* argv[]) {
  bool rounding_flag(kDefaultRoundingFlag);
  WarningType warning_type(kDefaultWarningType);
  int num_column(kDefaultNumColumn);
  std::string print_format("");
  std::string data_types(kDefaultDataTypes);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "re:c:f:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'r': {
        rounding_flag = true;
        break;
      }
      case 'e': {
        const int min(0);
        const int max(static_cast<int>(kNumWarningTypes) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("x2x", error_message);
          return 1;
        }
        warning_type = static_cast<WarningType>(tmp);
        break;
      }
      case 'c': {
        if (!sptk::ConvertStringToInteger(optarg, &num_column) ||
            num_column <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -c option must be a positive integer";
          sptk::PrintErrorMessage("x2x", error_message);
          return 1;
        }
        break;
      }
      case 'f': {
        print_format = optarg;
        if ("%" != print_format.substr(0, 1)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -f option must be begin with %";
          sptk::PrintErrorMessage("x2x", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_types = str.substr(1, std::string::npos);
      if (2 != data_types.size()) {
        std::ostringstream error_message;
        error_message << "The +type option must be two characters";
        sptk::PrintErrorMessage("x2x", error_message);
        return 1;
      }
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("x2x", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("x2x", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("x2x", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const std::string input_data_type(data_types.substr(0, 1));
  const std::string output_data_type(data_types.substr(1, 1));
  DataTransformWrapper data_transform(input_data_type, output_data_type,
                                      print_format, num_column, warning_type,
                                      rounding_flag);

  if (!data_transform.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("x2x", error_message);
    return 1;
  }

  if (!data_transform.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to transform";
    sptk::PrintErrorMessage("x2x", error_message);
    return 1;
  }

  return 0;
}